

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O0

void opj_j2k_read_float32_to_int32(void *p_src_data,void *p_dest_data,OPJ_UINT32 p_nb_elem)

{
  float local_38;
  uint local_34;
  OPJ_FLOAT32 l_temp;
  OPJ_UINT32 i;
  OPJ_INT32 *l_dest_data;
  OPJ_BYTE *l_src_data;
  void *pvStack_18;
  OPJ_UINT32 p_nb_elem_local;
  void *p_dest_data_local;
  void *p_src_data_local;
  
  _l_temp = (int *)p_dest_data;
  l_dest_data = (OPJ_INT32 *)p_src_data;
  l_src_data._4_4_ = p_nb_elem;
  pvStack_18 = p_dest_data;
  p_dest_data_local = p_src_data;
  for (local_34 = 0; local_34 < l_src_data._4_4_; local_34 = local_34 + 1) {
    opj_read_float_LE((OPJ_BYTE *)l_dest_data,(OPJ_FLOAT32 *)&local_38);
    l_dest_data = l_dest_data + 1;
    *_l_temp = (int)local_38;
    _l_temp = _l_temp + 1;
  }
  return;
}

Assistant:

static void  opj_j2k_read_float32_to_int32(const void * p_src_data,
        void * p_dest_data, OPJ_UINT32 p_nb_elem)
{
    OPJ_BYTE * l_src_data = (OPJ_BYTE *) p_src_data;
    OPJ_INT32 * l_dest_data = (OPJ_INT32 *) p_dest_data;
    OPJ_UINT32 i;
    OPJ_FLOAT32 l_temp;

    for (i = 0; i < p_nb_elem; ++i) {
        opj_read_float(l_src_data, &l_temp);

        l_src_data += sizeof(OPJ_FLOAT32);

        *(l_dest_data++) = (OPJ_INT32) l_temp;
    }
}